

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

unique_ptr<Kompositum::Composite,_std::default_delete<Kompositum::Composite>_> __thiscall
Kompositum::make_unique<Kompositum::Composite,unsigned_long&>(Kompositum *this,unsigned_long *args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[1] = *args;
  *puVar1 = &PTR__Composite_00103cf0;
  puVar1[4] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<Kompositum::Composite,_std::default_delete<Kompositum::Composite>,_true,_true>
          )(__uniq_ptr_data<Kompositum::Composite,_std::default_delete<Kompositum::Composite>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
    return std::unique_ptr<T>{new T{std::forward<Args>(args)...}};
}